

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O2

plutovg_gradient_paint_t *
plutovg_gradient_create
          (plutovg_gradient_type_t type,plutovg_spread_method_t spread,
          plutovg_gradient_stop_t *stops,int nstops,plutovg_matrix_t *matrix)

{
  float fVar1;
  bool bVar2;
  plutovg_gradient_paint_t *ppVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  ppVar3 = (plutovg_gradient_paint_t *)
           plutovg_paint_create(PLUTOVG_PAINT_TYPE_GRADIENT,(long)nstops * 0x14 + 0x50);
  ppVar3->type = type;
  ppVar3->spread = spread;
  if (matrix == (plutovg_matrix_t *)0x0) {
    (ppVar3->matrix).a = 1.0;
    (ppVar3->matrix).b = 0.0;
    (ppVar3->matrix).c = 0.0;
    (ppVar3->matrix).d = 1.0;
    (ppVar3->matrix).e = 0.0;
    (ppVar3->matrix).f = 0.0;
  }
  else {
    fVar6 = matrix->f;
    (ppVar3->matrix).e = matrix->e;
    (ppVar3->matrix).f = fVar6;
    fVar6 = matrix->b;
    fVar1 = matrix->c;
    fVar7 = matrix->d;
    (ppVar3->matrix).a = matrix->a;
    (ppVar3->matrix).b = fVar6;
    (ppVar3->matrix).c = fVar1;
    (ppVar3->matrix).d = fVar7;
  }
  ppVar3->stops = (plutovg_gradient_stop_t *)(ppVar3 + 1);
  ppVar3->nstops = nstops;
  uVar4 = 0;
  uVar5 = (ulong)(uint)nstops;
  if (nstops < 1) {
    uVar5 = uVar4;
  }
  fVar6 = 0.0;
  for (; uVar5 * 0x14 - uVar4 != 0; uVar4 = uVar4 + 0x14) {
    fVar1 = *(float *)((long)&stops->offset + uVar4);
    if (0.0 <= fVar1) {
      fVar7 = 1.0;
      if (fVar1 <= 1.0) {
        fVar7 = fVar1;
      }
      bVar2 = fVar6 <= fVar7;
      if (fVar6 <= fVar7) {
        fVar6 = 1.0;
      }
      if (bVar2 && fVar1 <= 1.0) {
        fVar6 = fVar1;
      }
    }
    else if (fVar6 <= 0.0) {
      fVar6 = 0.0;
    }
    *(float *)((long)ppVar3[1].values + (uVar4 - 0x34)) = fVar6;
    fVar1 = *(float *)((long)&(stops->color).r + uVar4);
    fVar7 = 0.0;
    if ((0.0 <= fVar1) && (fVar7 = 1.0, fVar1 <= 1.0)) {
      fVar7 = fVar1;
    }
    *(float *)((long)ppVar3[1].values + (uVar4 - 0x30)) = fVar7;
    fVar1 = *(float *)((long)&(stops->color).g + uVar4);
    fVar7 = 0.0;
    if ((0.0 <= fVar1) && (fVar7 = 1.0, fVar1 <= 1.0)) {
      fVar7 = fVar1;
    }
    *(float *)((long)ppVar3[1].values + (uVar4 - 0x2c)) = fVar7;
    fVar1 = *(float *)((long)&(stops->color).b + uVar4);
    fVar7 = 0.0;
    if ((0.0 <= fVar1) && (fVar7 = 1.0, fVar1 <= 1.0)) {
      fVar7 = fVar1;
    }
    *(float *)((long)ppVar3[1].values + (uVar4 - 0x28)) = fVar7;
    fVar1 = *(float *)((long)&(stops->color).a + uVar4);
    fVar7 = 0.0;
    if ((0.0 <= fVar1) && (fVar7 = 1.0, fVar1 <= 1.0)) {
      fVar7 = fVar1;
    }
    *(float *)((long)ppVar3[1].values + (uVar4 - 0x24)) = fVar7;
  }
  return ppVar3;
}

Assistant:

static plutovg_gradient_paint_t* plutovg_gradient_create(plutovg_gradient_type_t type, plutovg_spread_method_t spread, const plutovg_gradient_stop_t* stops, int nstops, const plutovg_matrix_t* matrix)
{
    plutovg_gradient_paint_t* gradient = plutovg_paint_create(PLUTOVG_PAINT_TYPE_GRADIENT, sizeof(plutovg_gradient_paint_t) + nstops * sizeof(plutovg_gradient_stop_t));
    gradient->type = type;
    gradient->spread = spread;
    gradient->matrix = matrix ? *matrix : PLUTOVG_IDENTITY_MATRIX;
    gradient->stops = (plutovg_gradient_stop_t*)(gradient + 1);
    gradient->nstops = nstops;

    float prev_offset = 0.f;
    for(int i = 0; i < nstops; ++i) {
        const plutovg_gradient_stop_t* stop = stops + i;
        gradient->stops[i].offset = plutovg_max(prev_offset, plutovg_clamp(stop->offset, 0.f, 1.f));
        gradient->stops[i].color.r = plutovg_clamp(stop->color.r, 0.f, 1.f);
        gradient->stops[i].color.g = plutovg_clamp(stop->color.g, 0.f, 1.f);
        gradient->stops[i].color.b = plutovg_clamp(stop->color.b, 0.f, 1.f);
        gradient->stops[i].color.a = plutovg_clamp(stop->color.a, 0.f, 1.f);
        prev_offset = gradient->stops[i].offset;
    }

    return gradient;
}